

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O3

void __thiscall
SharedMemRingBuffer::SharedMemRingBuffer(SharedMemRingBuffer *this,ENUM_WAIT_STRATEGY wait_strategy)

{
  RingBuffer<_PositionInfo__*>::RingBuffer(&this->ring_buffer_);
  SharedMemoryManager::SharedMemoryManager(&this->shared_raw_memory_buffer_);
  SharedMemoryManager::SharedMemoryManager(&this->shared_index_buffer_);
  this->ring_buffer_status_on_shared_mem_ = (StatusOnSharedMem *)0x0;
  this->max_data_size_ = 0;
  this->buffer_size_ = 0;
  this->total_mem_size_ = 0;
  this->wait_strategy_type_ = wait_strategy;
  this->wait_strategy_ = (WaitStrategyInterface *)0x0;
  return;
}

Assistant:

SharedMemRingBuffer::SharedMemRingBuffer(ENUM_WAIT_STRATEGY wait_strategy)
{
    max_data_size_ = 0;
    buffer_size_ = 0;
    total_mem_size_ = 0;
    ring_buffer_status_on_shared_mem_ = NULL;
    wait_strategy_type_ = wait_strategy ;
    wait_strategy_ = NULL;
}